

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_bmp(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  byte *pbVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uchar *puVar5;
  byte bVar6;
  int iVar7;
  size_t sVar8;
  CImg<unsigned_char> *pCVar9;
  ulong uVar10;
  CImgIOException *pCVar11;
  CImgArgumentException *pCVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  pointer_____offset_0x10___ *ppuVar21;
  byte bVar22;
  char *pcVar23;
  char *pcVar24;
  size_t sVar25;
  FILE *pFVar26;
  uint uVar27;
  long lVar28;
  byte *pbVar29;
  CImg<unsigned_char> buffer;
  CImg<int> colormap;
  CImg<unsigned_char> header;
  uchar local_f9;
  ulong local_f8;
  ulong local_f0;
  FILE *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  uint local_c4;
  ulong local_c0;
  CImg<unsigned_char> local_b8;
  FILE *local_98;
  uint local_90;
  int local_8c;
  CImg<int> local_88;
  char *local_60;
  ulong local_58;
  CImg<unsigned_char> local_50;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar24 = "non-";
    if (this->_is_shared != false) {
      pcVar24 = "";
    }
    CImgArgumentException::CImgArgumentException
              (pCVar12,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar24,"unsigned char");
    __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  local_98 = file;
  if (file == (FILE *)0x0) {
    file = (FILE *)cimg::fopen(filename,"rb");
  }
  local_60 = filename;
  CImg(&local_50,0x36,1,1,1);
  puVar5 = local_50._data;
  local_e8 = (FILE *)file;
  if (((FILE *)file == (FILE *)0x0) || (local_50._data == (uchar *)0x0)) {
    pCVar11 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)pCVar11,
               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",0x36,
               "unsigned char","s",local_e8,local_50._data);
    ppuVar21 = &CImgArgumentException::typeinfo;
  }
  else {
    uVar18 = 0x36;
    lVar28 = 0;
    do {
      sVar25 = 0x3f00000;
      if (uVar18 < 0x3f00000) {
        sVar25 = uVar18;
      }
      sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
      lVar28 = lVar28 + sVar8;
      uVar18 = uVar18 - sVar8;
    } while ((sVar25 == sVar8) && (uVar18 != 0));
    if (uVar18 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar28,0x36);
    }
    pFVar26 = local_e8;
    if ((*local_50._data == 'B') && (local_50._data[1] == 'M')) {
      iVar7 = *(int *)(local_50._data + 2);
      iVar2 = *(int *)(local_50._data + 10);
      local_d0 = (ulong)*(uint *)(local_50._data + 0xe);
      local_f8 = (long)(int)((uint)local_50._data[0x15] << 0x18) |
                 (ulong)*(ushort *)(local_50._data + 0x13) << 8;
      local_c4 = (uint)*(ushort *)(local_50._data + 0x16);
      bVar15 = local_50._data[0x18];
      bVar6 = local_50._data[0x19];
      local_8c = *(int *)(local_50._data + 0x1e);
      local_f0 = CONCAT44(local_f0._4_4_,*(undefined4 *)(local_50._data + 0x2e));
      uVar27 = (uint)*(ushort *)(local_50._data + 0x1c);
      local_e0 = CONCAT44(local_e0._4_4_,(uint)*(ushort *)(local_50._data + 0x1c));
      if ((iVar7 == 0) || (uVar18 = (ulong)local_50._data[0x12], iVar7 == iVar2)) {
        local_c4 = (uint)*(ushort *)(local_50._data + 0x16);
        local_d8 = (ulong)local_50._data[0x12];
        fseek(local_e8,0,2);
        lVar28 = ftell(pFVar26);
        iVar7 = (int)lVar28;
        uVar27 = (uint)local_e0;
        fseek(pFVar26,0x36,0);
        uVar18 = local_d8;
      }
      local_f8 = local_f8 + uVar18;
      uVar17 = (uint)bVar15 << 0x10 | local_c4;
      local_c4 = (uint)bVar6 << 0x18;
      if (0x28 < (int)local_d0) {
        fseek(local_e8,(ulong)((int)local_d0 - 0x28),1);
      }
      pFVar26 = local_e8;
      uVar17 = uVar17 | local_c4;
      iVar4 = (int)local_f8;
      if (uVar27 == 4) {
        uVar27 = ((uint)(local_f8 >> 0x1f) & 1) + iVar4;
        uVar18 = (ulong)(((int)uVar27 >> 1) + (iVar4 - (uVar27 & 0xfffffffe)));
      }
      else if (uVar27 == 1) {
        iVar16 = iVar4 + 7;
        if (-1 < iVar4) {
          iVar16 = iVar4;
        }
        uVar18 = (ulong)(((iVar16 >> 3) + 1) - (uint)((uVar18 & 7) == 0));
      }
      else {
        uVar10 = uVar27 * local_f8;
        uVar18 = uVar10 + 7;
        if (-1 < (long)uVar10) {
          uVar18 = uVar10;
        }
        uVar18 = uVar18 >> 3;
      }
      local_90 = -(int)uVar18 & 3;
      local_c0 = (ulong)local_90;
      uVar27 = -uVar17;
      if (0 < (int)uVar17) {
        uVar27 = uVar17;
      }
      local_58 = (ulong)uVar27;
      local_90 = local_90 + (int)uVar18;
      local_d8 = (long)iVar7 - (long)iVar2;
      if ((long)(int)local_90 * local_58 <= (ulong)((long)iVar7 - (long)iVar2)) {
        local_d8 = (long)(int)local_90 * local_58;
      }
      local_88._data = (int *)0x0;
      local_88._width = 0;
      local_88._height = 0;
      local_88._depth = 0;
      local_88._spectrum = 0;
      local_88._is_shared = false;
      uVar27 = 1 << ((byte)local_e0 & 0x1f);
      if ((uint)local_f0 != 0) {
        uVar27 = (uint)local_f0;
      }
      iVar7 = 0;
      if ((uint)local_e0 < 0x10) {
        CImg<int>::assign(&local_88,uVar27,1,1,1);
        cimg::fread<int>(local_88._data,(long)(int)uVar27,(FILE *)pFVar26);
        iVar7 = uVar27 << 2;
      }
      uVar27 = (iVar2 - ((int)local_d0 + iVar7)) - 0xe;
      if (0 < (int)uVar27) {
        fseek(pFVar26,(ulong)uVar27,1);
      }
      uVar10 = local_d8;
      local_b8._data = (byte *)0x0;
      local_b8._width = 0;
      local_b8._height = 0;
      local_b8._depth = 0;
      local_b8._spectrum = 0;
      local_b8._is_shared = false;
      local_d0 = uVar18;
      if (local_d8 < 0x1800000) {
        local_f9 = '\0';
        pCVar9 = assign(&local_b8,(uint)local_d8,1,1,1);
        fill(pCVar9,&local_f9);
        puVar5 = local_b8._data;
        if (local_b8._data == (byte *)0x0) {
          pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
          pcVar24 = "";
          if (1 < uVar10) {
            pcVar24 = "s";
          }
          CImgArgumentException::CImgArgumentException
                    (pCVar12,
                     "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                     uVar10,"unsigned char",pcVar24,local_e8,0);
          __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,CImgException::~CImgException);
        }
        if (uVar10 != 0) {
          lVar28 = 0;
          uVar18 = local_d8;
          do {
            sVar25 = 0x3f00000;
            if (uVar18 < 0x3f00000) {
              sVar25 = uVar18;
            }
            sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
            lVar28 = lVar28 + sVar8;
            uVar18 = uVar18 - sVar8;
          } while ((sVar25 == sVar8) && (uVar18 != 0));
          if (uVar18 != 0) {
            cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar28,
                       local_d8);
          }
        }
      }
      else {
        assign(&local_b8,local_90,1,1,1);
      }
      pcVar24 = local_60;
      pbVar29 = local_b8._data;
      if (local_8c - 1U < 2) {
        if (local_98 != (FILE *)0x0) {
          pCVar11 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar24 = "non-";
          if (this->_is_shared != false) {
            pcVar24 = "";
          }
          CImgIOException::CImgIOException
                    (pCVar11,
                     "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Unable to load compressed data from \'(*FILE)\' inputs."
                     ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                     (ulong)this->_spectrum,this->_data,pcVar24,"unsigned char");
          __cxa_throw(pCVar11,&CImgIOException::typeinfo,CImgException::~CImgException);
        }
        if (((_stdin != local_e8) && (_stdout != local_e8)) &&
           (uVar27 = fclose(local_e8), uVar27 != 0)) {
          cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar27);
        }
        this = load_other(this,pcVar24);
      }
      else {
        local_f9 = '\0';
        pCVar9 = assign(this,(uint)local_f8,(uint)local_58,1,3);
        uVar18 = local_d0;
        pFVar26 = local_e8;
        fill(pCVar9,&local_f9);
        iVar7 = (int)uVar18;
        if ((ushort)local_e0 < 0x10) {
          if ((ushort)local_e0 == 1) {
            if ((1 < local_88._width) &&
               (uVar10 = (ulong)(int)this->_height, local_f8 = uVar10, 0 < (long)uVar10)) {
              local_f0 = (ulong)iVar7;
              local_e0 = local_c0 & 0xffffffff;
              uVar19 = local_d8;
              do {
                puVar5 = local_b8._data;
                uVar10 = uVar10 - 1;
                if (0x17fffff < uVar19) {
                  if (local_b8._data == (byte *)0x0) {
                    pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                    pcVar24 = "";
                    if (1 < (uint)uVar18) {
                      pcVar24 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar12,
                               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,local_f0,"unsigned char",pcVar24,pFVar26,0);
                    __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,
                                CImgException::~CImgException);
                  }
                  if ((uint)uVar18 == 0) break;
                  lVar28 = 0;
                  uVar18 = local_f0;
                  do {
                    sVar25 = 0x3f00000;
                    if (uVar18 < 0x3f00000) {
                      sVar25 = uVar18;
                    }
                    sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
                    lVar28 = lVar28 + sVar8;
                    uVar18 = uVar18 - sVar8;
                  } while ((sVar25 == sVar8) && (uVar18 != 0));
                  if (uVar18 != 0) {
                    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                               lVar28,local_f0);
                  }
                  uVar18 = local_d0;
                  uVar19 = local_d8;
                  pFVar26 = local_e8;
                  if (lVar28 == 0) break;
                  fseek(local_e8,local_e0,1);
                }
                uVar13 = (ulong)this->_width;
                if (0 < (int)this->_width) {
                  lVar28 = 0;
                  do {
                    this->_data
                    [lVar28 + ((ulong)this->_height * 2 + uVar10) * (uVar13 & 0xffffffff)] =
                         (uchar)*local_88._data;
                    this->_data[lVar28 + (this->_height + uVar10) * (ulong)this->_width] =
                         *(uchar *)((long)local_88._data + 1);
                    this->_data[lVar28 + this->_width * uVar10] =
                         *(uchar *)((long)local_88._data + 2);
                    lVar28 = lVar28 + 1;
                    uVar13 = (ulong)(int)this->_width;
                  } while (lVar28 < (long)uVar13);
                }
                uVar13 = local_f8 - 1;
                bVar3 = 1 < (long)local_f8;
                local_f8 = uVar13;
              } while (bVar3);
            }
          }
          else if ((ushort)local_e0 == 4) {
            if ((0xf < local_88._width) &&
               (uVar10 = (ulong)(int)this->_height, local_f8 = uVar10, 0 < (long)uVar10)) {
              local_f0 = (ulong)iVar7;
              local_e0 = local_c0 & 0xffffffff;
              uVar19 = local_d8;
              do {
                puVar5 = local_b8._data;
                uVar10 = uVar10 - 1;
                if (0x17fffff < uVar19) {
                  if (local_b8._data == (byte *)0x0) {
                    pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                    pcVar24 = "";
                    if (1 < (uint)uVar18) {
                      pcVar24 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar12,
                               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,local_f0,"unsigned char",pcVar24,pFVar26,0);
                    __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,
                                CImgException::~CImgException);
                  }
                  if ((uint)uVar18 == 0) break;
                  lVar28 = 0;
                  uVar18 = local_f0;
                  do {
                    sVar25 = 0x3f00000;
                    if (uVar18 < 0x3f00000) {
                      sVar25 = uVar18;
                    }
                    sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
                    lVar28 = lVar28 + sVar8;
                    uVar18 = uVar18 - sVar8;
                  } while ((sVar25 == sVar8) && (uVar18 != 0));
                  if (uVar18 != 0) {
                    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                               lVar28,local_f0);
                  }
                  uVar18 = local_d0;
                  uVar19 = local_d8;
                  pFVar26 = local_e8;
                  if (lVar28 == 0) break;
                  fseek(local_e8,local_e0,1);
                  pbVar29 = puVar5;
                }
                uVar13 = (ulong)this->_width;
                if (0 < (int)this->_width) {
                  bVar6 = 0xf0;
                  lVar28 = 0;
                  bVar15 = 0;
                  do {
                    if (bVar6 == 0xf0) {
                      bVar15 = *pbVar29;
                      pbVar29 = pbVar29 + 1;
                    }
                    bVar22 = (bVar15 & bVar6) >> 4;
                    if (bVar6 < 0x10) {
                      bVar22 = bVar15 & bVar6;
                    }
                    uVar20 = (ulong)bVar22;
                    this->_data
                    [lVar28 + ((ulong)this->_height * 2 + uVar10) * (uVar13 & 0xffffffff)] =
                         (uchar)local_88._data[uVar20];
                    this->_data[lVar28 + (this->_height + uVar10) * (ulong)this->_width] =
                         *(uchar *)((long)local_88._data + uVar20 * 4 + 1);
                    bVar6 = bVar6 << 4 | bVar6 >> 4;
                    this->_data[lVar28 + this->_width * uVar10] =
                         *(uchar *)((long)local_88._data + uVar20 * 4 + 2);
                    lVar28 = lVar28 + 1;
                    uVar13 = (ulong)(int)this->_width;
                  } while (lVar28 < (long)uVar13);
                }
                uVar13 = local_f8 - 1;
                pbVar29 = pbVar29 + local_e0;
                bVar3 = 1 < (long)local_f8;
                local_f8 = uVar13;
              } while (bVar3);
            }
          }
          else if ((((ushort)local_e0 == 8) && (0xff < local_88._width)) &&
                  (uVar10 = (ulong)(int)this->_height, local_f8 = uVar10, 0 < (long)uVar10)) {
            local_f0 = (ulong)iVar7;
            local_e0 = local_c0 & 0xffffffff;
            uVar19 = local_d8;
            do {
              puVar5 = local_b8._data;
              uVar10 = uVar10 - 1;
              if (0x17fffff < uVar19) {
                if (local_b8._data == (byte *)0x0) {
                  pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                  pcVar24 = "";
                  if (1 < (uint)uVar18) {
                    pcVar24 = "s";
                  }
                  CImgArgumentException::CImgArgumentException
                            (pCVar12,
                             "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                             ,local_f0,"unsigned char",pcVar24,pFVar26,0);
                  __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,CImgException::~CImgException
                             );
                }
                if ((uint)uVar18 == 0) break;
                lVar28 = 0;
                uVar18 = local_f0;
                do {
                  sVar25 = 0x3f00000;
                  if (uVar18 < 0x3f00000) {
                    sVar25 = uVar18;
                  }
                  sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
                  lVar28 = lVar28 + sVar8;
                  uVar18 = uVar18 - sVar8;
                } while ((sVar25 == sVar8) && (uVar18 != 0));
                if (uVar18 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar28,
                             local_f0);
                }
                uVar18 = local_d0;
                uVar19 = local_d8;
                pFVar26 = local_e8;
                if (lVar28 == 0) break;
                fseek(local_e8,local_e0,1);
                pbVar29 = puVar5;
              }
              uVar13 = (ulong)this->_width;
              if (0 < (int)this->_width) {
                lVar28 = 0;
                do {
                  uVar20 = (ulong)pbVar29[lVar28];
                  this->_data[lVar28 + ((ulong)this->_height * 2 + uVar10) * (uVar13 & 0xffffffff)]
                       = (uchar)local_88._data[uVar20];
                  this->_data[lVar28 + (this->_height + uVar10) * (ulong)this->_width] =
                       *(uchar *)((long)local_88._data + uVar20 * 4 + 1);
                  this->_data[lVar28 + this->_width * uVar10] =
                       *(uchar *)((long)local_88._data + uVar20 * 4 + 2);
                  lVar28 = lVar28 + 1;
                  uVar13 = (ulong)(int)this->_width;
                } while (lVar28 < (long)uVar13);
                pbVar29 = pbVar29 + lVar28;
              }
              uVar13 = local_f8 - 1;
              pbVar29 = pbVar29 + local_e0;
              bVar3 = 1 < (long)local_f8;
              local_f8 = uVar13;
            } while (bVar3);
          }
        }
        else if ((ushort)local_e0 == 0x10) {
          uVar10 = (ulong)(int)this->_height;
          local_f8 = uVar10;
          if (0 < (long)uVar10) {
            local_f0 = (ulong)iVar7;
            local_e0 = local_c0 & 0xffffffff;
            uVar19 = local_d8;
            do {
              puVar5 = local_b8._data;
              uVar10 = uVar10 - 1;
              if (0x17fffff < uVar19) {
                if (local_b8._data == (byte *)0x0) {
                  pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                  pcVar24 = "";
                  if (1 < (uint)uVar18) {
                    pcVar24 = "s";
                  }
                  CImgArgumentException::CImgArgumentException
                            (pCVar12,
                             "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                             ,local_f0,"unsigned char",pcVar24,pFVar26,0);
                  __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,CImgException::~CImgException
                             );
                }
                if ((uint)uVar18 == 0) break;
                lVar28 = 0;
                uVar18 = local_f0;
                do {
                  sVar25 = 0x3f00000;
                  if (uVar18 < 0x3f00000) {
                    sVar25 = uVar18;
                  }
                  sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
                  lVar28 = lVar28 + sVar8;
                  uVar18 = uVar18 - sVar8;
                } while ((sVar25 == sVar8) && (uVar18 != 0));
                if (uVar18 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar28,
                             local_f0);
                }
                uVar18 = local_d0;
                uVar19 = local_d8;
                pFVar26 = local_e8;
                if (lVar28 == 0) break;
                fseek(local_e8,local_e0,1);
                pbVar29 = puVar5;
              }
              uVar13 = (ulong)this->_width;
              if (0 < (int)this->_width) {
                lVar28 = 0;
                lVar14 = 0;
                do {
                  bVar15 = pbVar29[lVar14 * 2];
                  bVar6 = pbVar29[lVar14 * 2 + 1];
                  this->_data[lVar14 + ((ulong)this->_height * 2 + uVar10) * (uVar13 & 0xffffffff)]
                       = bVar15 * '\b';
                  this->_data[lVar14 + (this->_height + uVar10) * (ulong)this->_width] =
                       (byte)(CONCAT11(bVar6,bVar15) >> 2) & 0xf8;
                  this->_data[lVar14 + this->_width * uVar10] = bVar6 & 0xf8;
                  lVar14 = lVar14 + 1;
                  uVar13 = (ulong)(int)this->_width;
                  lVar28 = lVar28 + 2;
                } while (lVar14 < (long)uVar13);
                pbVar29 = pbVar29 + lVar28;
              }
              uVar13 = local_f8 - 1;
              pbVar29 = pbVar29 + local_e0;
              bVar3 = 1 < (long)local_f8;
              local_f8 = uVar13;
            } while (bVar3);
          }
        }
        else if ((ushort)local_e0 == 0x18) {
          uVar10 = (ulong)(int)this->_height;
          local_f8 = uVar10;
          if (0 < (long)uVar10) {
            local_f0 = (ulong)iVar7;
            local_e0 = local_c0 & 0xffffffff;
            uVar19 = local_d8;
            do {
              puVar5 = local_b8._data;
              uVar10 = uVar10 - 1;
              if (0x17fffff < uVar19) {
                if (local_b8._data == (byte *)0x0) {
                  pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                  pcVar24 = "";
                  if (1 < (uint)uVar18) {
                    pcVar24 = "s";
                  }
                  CImgArgumentException::CImgArgumentException
                            (pCVar12,
                             "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                             ,local_f0,"unsigned char",pcVar24,pFVar26,0);
                  __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,CImgException::~CImgException
                             );
                }
                if ((uint)uVar18 == 0) break;
                lVar28 = 0;
                uVar18 = local_f0;
                do {
                  sVar25 = 0x3f00000;
                  if (uVar18 < 0x3f00000) {
                    sVar25 = uVar18;
                  }
                  sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
                  lVar28 = lVar28 + sVar8;
                  uVar18 = uVar18 - sVar8;
                } while ((sVar25 == sVar8) && (uVar18 != 0));
                if (uVar18 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar28,
                             local_f0);
                }
                uVar18 = local_d0;
                uVar19 = local_d8;
                pFVar26 = local_e8;
                if (lVar28 == 0) break;
                fseek(local_e8,local_e0,1);
                pbVar29 = puVar5;
              }
              uVar13 = (ulong)this->_width;
              if (0 < (int)this->_width) {
                lVar28 = 0;
                do {
                  this->_data[lVar28 + ((ulong)this->_height * 2 + uVar10) * (uVar13 & 0xffffffff)]
                       = *pbVar29;
                  this->_data[lVar28 + (this->_height + uVar10) * (ulong)this->_width] = pbVar29[1];
                  pbVar1 = pbVar29 + 2;
                  pbVar29 = pbVar29 + 3;
                  this->_data[lVar28 + this->_width * uVar10] = *pbVar1;
                  lVar28 = lVar28 + 1;
                  uVar13 = (ulong)(int)this->_width;
                } while (lVar28 < (long)uVar13);
              }
              uVar13 = local_f8 - 1;
              pbVar29 = pbVar29 + local_e0;
              bVar3 = 1 < (long)local_f8;
              local_f8 = uVar13;
            } while (bVar3);
          }
        }
        else if (((ushort)local_e0 == 0x20) &&
                (uVar10 = (ulong)(int)this->_height, local_f8 = uVar10, 0 < (long)uVar10)) {
          local_f0 = (ulong)iVar7;
          local_e0 = local_c0 & 0xffffffff;
          uVar19 = local_d8;
          do {
            puVar5 = local_b8._data;
            uVar10 = uVar10 - 1;
            if (0x17fffff < uVar19) {
              if (local_b8._data == (byte *)0x0) {
                pCVar12 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar24 = "";
                if (1 < (uint)uVar18) {
                  pcVar24 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (pCVar12,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,local_f0,"unsigned char",pcVar24,pFVar26,0);
                __cxa_throw(pCVar12,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              if ((uint)uVar18 == 0) break;
              lVar28 = 0;
              uVar18 = local_f0;
              do {
                sVar25 = 0x3f00000;
                if (uVar18 < 0x3f00000) {
                  sVar25 = uVar18;
                }
                sVar8 = fread(puVar5 + lVar28,1,sVar25,local_e8);
                lVar28 = lVar28 + sVar8;
                uVar18 = uVar18 - sVar8;
              } while ((sVar25 == sVar8) && (uVar18 != 0));
              if (uVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar28,
                           local_f0);
              }
              uVar18 = local_d0;
              uVar19 = local_d8;
              pFVar26 = local_e8;
              if (lVar28 == 0) break;
              fseek(local_e8,local_e0,1);
              pbVar29 = puVar5;
            }
            uVar13 = (ulong)this->_width;
            if (0 < (int)this->_width) {
              lVar28 = 0;
              lVar14 = 0;
              do {
                this->_data[lVar14 + ((ulong)this->_height * 2 + uVar10) * (uVar13 & 0xffffffff)] =
                     pbVar29[lVar14 * 4];
                this->_data[lVar14 + (this->_height + uVar10) * (ulong)this->_width] =
                     pbVar29[lVar14 * 4 + 1];
                this->_data[lVar14 + this->_width * uVar10] = pbVar29[lVar14 * 4 + 2];
                lVar14 = lVar14 + 1;
                uVar13 = (ulong)(int)this->_width;
                lVar28 = lVar28 + 4;
              } while (lVar14 < (long)uVar13);
              pbVar29 = pbVar29 + lVar28;
            }
            uVar13 = local_f8 - 1;
            pbVar29 = pbVar29 + local_e0;
            bVar3 = 1 < (long)local_f8;
            local_f8 = uVar13;
          } while (bVar3);
        }
        if ((int)local_c4 < 0) {
          mirror(this,'y');
        }
        if (((local_98 == (FILE *)0x0) && (_stdin != pFVar26)) &&
           ((_stdout != pFVar26 && (uVar27 = fclose(pFVar26), uVar27 != 0)))) {
          cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar27);
        }
      }
      if ((local_b8._is_shared == false) && (local_b8._data != (byte *)0x0)) {
        operator_delete__(local_b8._data);
      }
      if ((local_88._is_shared == false) && (local_88._data != (int *)0x0)) {
        operator_delete__(local_88._data);
      }
      if ((local_50._is_shared == false) && (local_50._data != (uchar *)0x0)) {
        operator_delete__(local_50._data);
      }
      return this;
    }
    if (local_98 == (FILE *)0x0) {
      cimg::fclose(local_e8);
    }
    pCVar11 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar24 = "non-";
    if (this->_is_shared != false) {
      pcVar24 = "";
    }
    pcVar23 = "(FILE*)";
    if (local_60 != (char *)0x0) {
      pcVar23 = local_60;
    }
    CImgIOException::CImgIOException
              (pCVar11,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Invalid BMP file \'%s\'.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar24,"unsigned char",pcVar23);
    ppuVar21 = &CImgIOException::typeinfo;
  }
  __cxa_throw(pCVar11,ppuVar21,CImgException::~CImgException);
}

Assistant:

CImg<T>& _load_bmp(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_bmp(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<ucharT> header(54);
      cimg::fread(header._data,54,nfile);
      if (*header!='B' || header[1]!='M') {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_bmp(): Invalid BMP file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }

      // Read header and pixel buffer
      int
        file_size = header[0x02] + (header[0x03]<<8) + (header[0x04]<<16) + (header[0x05]<<24),
        offset = header[0x0A] + (header[0x0B]<<8) + (header[0x0C]<<16) + (header[0x0D]<<24),
        header_size = header[0x0E] + (header[0x0F]<<8) + (header[0x10]<<16) + (header[0x11]<<24),
        dx = header[0x12] + (header[0x13]<<8) + (header[0x14]<<16) + (header[0x15]<<24),
        dy = header[0x16] + (header[0x17]<<8) + (header[0x18]<<16) + (header[0x19]<<24),
        compression = header[0x1E] + (header[0x1F]<<8) + (header[0x20]<<16) + (header[0x21]<<24),
        nb_colors = header[0x2E] + (header[0x2F]<<8) + (header[0x30]<<16) + (header[0x31]<<24),
        bpp = header[0x1C] + (header[0x1D]<<8);

      if (!file_size || file_size==offset) {
        cimg::fseek(nfile,0,SEEK_END);
        file_size = (int)cimg::ftell(nfile);
        cimg::fseek(nfile,54,SEEK_SET);
      }
      if (header_size>40) cimg::fseek(nfile,header_size - 40,SEEK_CUR);

      const int
        dx_bytes = (bpp==1)?(dx/8 + (dx%8?1:0)):((bpp==4)?(dx/2 + (dx%2)):(int)((longT)dx*bpp/8)),
        align_bytes = (4 - dx_bytes%4)%4;
      const ulongT
        cimg_iobuffer = (ulongT)24*1024*1024,
        buf_size = std::min((ulongT)cimg::abs(dy)*(dx_bytes + align_bytes),(ulongT)file_size - offset);

      CImg<intT> colormap;
      if (bpp<16) { if (!nb_colors) nb_colors = 1<<bpp; } else nb_colors = 0;
      if (nb_colors) { colormap.assign(nb_colors); cimg::fread(colormap._data,nb_colors,nfile); }
      const int xoffset = offset - 14 - header_size - 4*nb_colors;
      if (xoffset>0) cimg::fseek(nfile,xoffset,SEEK_CUR);

      CImg<ucharT> buffer;
      if (buf_size<cimg_iobuffer) {
        buffer.assign(buf_size,1,1,1,0);
        cimg::fread(buffer._data,buf_size,nfile);
      } else buffer.assign(dx_bytes + align_bytes);
      unsigned char *ptrs = buffer;

      // Decompress buffer (if necessary)
      if (compression==1 || compression==2) {
        if (file)
          throw CImgIOException(_cimg_instance
                                "load_bmp(): Unable to load compressed data from '(*FILE)' inputs.",
                                cimg_instance);
        else {
          if (!file) cimg::fclose(nfile);
          return load_other(filename);
        }
      }

      // Read pixel data
      assign(dx,cimg::abs(dy),1,3,0);
      switch (bpp) {
      case 1 : { // Monochrome
        if (colormap._width>=2) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0x80, val = 0;
          cimg_forX(*this,x) {
            if (mask==0x80) val = *(ptrs++);
            const unsigned char *col = (unsigned char*)(colormap._data + (val&mask?1:0));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 4 : { // 16 colors
        if (colormap._width>=16) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0xF0, val = 0;
          cimg_forX(*this,x) {
            if (mask==0xF0) val = *(ptrs++);
            const unsigned char color = (unsigned char)((mask<16)?(val&mask):((val&mask)>>4));
            const unsigned char *col = (unsigned char*)(colormap._data + color);
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask,4);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 8 : { // 256 colors
        if (colormap._width>=256) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char *col = (unsigned char*)(colormap._data + *(ptrs++));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 16 : { // 16 bits colors (RGB565)
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char c1 = *(ptrs++), c2 = *(ptrs++);
            const unsigned short col = (unsigned short)c2<<8 | c1;
            (*this)(x,y,2) = (T)((col&0x1F)<<3);
            (*this)(x,y,1) = (T)(((col>>5)&0x3F)<<3);
            (*this)(x,y,0) = (T)(((col>>11)&0x1F)<<3);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 24 : { // 24 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 32 : { // 32 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
            ++ptrs;
          }
          ptrs+=align_bytes;
        }
      } break;
      }